

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::Write(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double *p;
  ON__INT32 i;
  int iVar6;
  size_t count;
  ON_BoundingBox bbox;
  ON_BoundingBox local_60;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_dim);
    iVar3 = 0;
    bVar2 = false;
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_is_rat);
      if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_order[0]), bVar1)) &&
          (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_order[1]), bVar1)) &&
         ((bVar1 = ON_BinaryArchive::WriteInt(file,this->m_cv_count[0]), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_cv_count[1]), bVar1)))) {
        bVar2 = false;
        bVar1 = ON_BinaryArchive::WriteInt(file,0);
        if (bVar1) {
          bVar2 = false;
          bVar1 = ON_BinaryArchive::WriteInt(file,0);
          if (bVar1) {
            ON_BoundingBox::ON_BoundingBox(&local_60);
            bVar2 = ON_BinaryArchive::WriteBoundingBox(file,&local_60);
          }
        }
      }
      else {
        bVar2 = false;
      }
    }
    if (this->m_knot[0] != (double *)0x0) {
      iVar3 = ON_KnotCount(this->m_order[0],this->m_cv_count[0]);
    }
    iVar4 = 0;
    bVar1 = false;
    if (bVar2 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,iVar3);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteDouble(file,(long)iVar3,this->m_knot[0]);
      }
      else {
        bVar1 = false;
      }
    }
    if (this->m_knot[1] != (double *)0x0) {
      iVar4 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
    }
    bVar2 = false;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,iVar4);
      if (bVar1) {
        bVar2 = ON_BinaryArchive::WriteDouble(file,(long)iVar4,this->m_knot[1]);
      }
      else {
        bVar2 = false;
      }
    }
    count = ((long)this->m_dim + 1) - (ulong)(this->m_is_rat == 0);
    i = 0;
    if (((this->m_cv != (double *)0x0) && (iVar3 = (int)count, 0 < iVar3)) &&
       (i = 0, 0 < this->m_cv_count[0])) {
      i = this->m_cv_count[0] * this->m_cv_count[1];
      if (this->m_cv_stride[1] < iVar3) {
        i = 0;
      }
      if (this->m_cv_stride[0] < iVar3) {
        i = 0;
      }
      if (this->m_cv_count[1] < 1) {
        i = 0;
      }
    }
    if (bVar2 == false) {
      bVar2 = false;
    }
    else {
      bVar2 = ON_BinaryArchive::WriteInt(file,i);
      if (0 < i && bVar2) {
        iVar3 = this->m_cv_count[0];
        if (iVar3 < 1) {
          bVar2 = true;
        }
        else {
          iVar4 = this->m_cv_count[1];
          bVar2 = true;
          iVar6 = 0;
          do {
            if ((0 < iVar4) && (bVar2 != false)) {
              iVar3 = 1;
              do {
                uVar5 = (iVar3 + -1) * this->m_cv_stride[1] + this->m_cv_stride[0] * iVar6;
                p = this->m_cv + uVar5;
                if ((int)uVar5 < 0) {
                  p = (double *)0x0;
                }
                if (this->m_cv == (double *)0x0) {
                  p = (double *)0x0;
                }
                bVar2 = ON_BinaryArchive::WriteDouble(file,count,p);
                iVar4 = this->m_cv_count[1];
              } while ((iVar3 < iVar4) && (iVar3 = iVar3 + 1, bVar2));
              iVar3 = this->m_cv_count[0];
            }
            iVar6 = iVar6 + 1;
          } while ((iVar6 < iVar3) && (bVar2 != false));
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_NurbsSurface::Write(
       ON_BinaryArchive&  file // open binary file
     ) const
{
  // NOTE - check legacy I/O code if changed
  bool rc = file.Write3dmChunkVersion(1,0);
  if (rc) {
    if (rc) rc = file.WriteInt( m_dim );
    if (rc) rc = file.WriteInt( m_is_rat );
    if (rc) rc = file.WriteInt( m_order[0] );
    if (rc) rc = file.WriteInt( m_order[1] );
    if (rc) rc = file.WriteInt( m_cv_count[0] );
    if (rc) rc = file.WriteInt( m_cv_count[1] );

    if (rc) rc = file.WriteInt(0); // reserved1
    if (rc) rc = file.WriteInt(0); // reserved2

    if (rc) {
      ON_BoundingBox bbox; // write invalid bounding box - may be used in future
      rc = file.WriteBoundingBox(bbox);
    }
    
    int count = m_knot[0] ? KnotCount(0) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[0] );

    count = m_knot[1] ? KnotCount(1) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[1] );

    const int cv_size = CVSize();
    count = ( m_cv && cv_size > 0
              && m_cv_count[0] > 0 && m_cv_count[1] > 0 
              && m_cv_stride[0] >= cv_size && m_cv_stride[1] >= cv_size) 
          ? m_cv_count[0]*m_cv_count[1]
          : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc && count > 0 ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.WriteDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  return rc;
}